

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O0

void __thiscall rotate_y::rotate_y(rotate_y *this,shared_ptr<hittable> *object,double angle)

{
  element_type *peVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  aabb local_120;
  int local_ec;
  undefined1 local_e8 [4];
  int c;
  vec3 tester;
  double newz;
  double newx;
  double z;
  double y;
  double x;
  int local_a0;
  int k;
  int j;
  int i;
  point3 max;
  point3 min;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double radians;
  double angle_local;
  shared_ptr<hittable> *object_local;
  rotate_y *this_local;
  
  hittable::hittable(&this->super_hittable);
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__rotate_y_00133b68;
  std::shared_ptr<hittable>::shared_ptr(&this->object,object);
  aabb::aabb(&this->bbox);
  dVar3 = degrees_to_radians(angle);
  dVar4 = sin(dVar3);
  this->sin_theta = dVar4;
  dVar3 = cos(dVar3);
  this->cos_theta = dVar3;
  peVar1 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      object);
  (*peVar1->_vptr_hittable[3])(min.e + 2);
  (this->bbox).z.min = local_48;
  (this->bbox).z.max = dStack_40;
  (this->bbox).y.min = local_58;
  (this->bbox).y.max = dStack_50;
  (this->bbox).x.min = min.e[2];
  (this->bbox).x.max = dStack_60;
  vec3::vec3((vec3 *)(max.e + 2),INFINITY,INFINITY,INFINITY);
  vec3::vec3((vec3 *)&j,-INFINITY,-INFINITY,-INFINITY);
  for (k = 0; k < 2; k = k + 1) {
    for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
      for (x._4_4_ = 0; x._4_4_ < 2; x._4_4_ = x._4_4_ + 1) {
        dVar3 = (double)k * (this->bbox).x.max + (double)(1 - k) * (this->bbox).x.min;
        dVar4 = (double)x._4_4_ * (this->bbox).z.max + (double)(1 - x._4_4_) * (this->bbox).z.min;
        tester.e[2] = this->cos_theta * dVar4 - this->sin_theta * dVar3;
        vec3::vec3((vec3 *)local_e8,this->cos_theta * dVar3 + this->sin_theta * dVar4,
                   (double)local_a0 * (this->bbox).y.max +
                   (double)(1 - local_a0) * (this->bbox).y.min,tester.e[2]);
        for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
          pdVar2 = vec3::operator[]((vec3 *)(max.e + 2),local_ec);
          dVar3 = *pdVar2;
          pdVar2 = vec3::operator[]((vec3 *)local_e8,local_ec);
          dVar4 = *pdVar2;
          uVar5 = SUB84(dVar4,0);
          uVar6 = (int)((ulong)dVar4 >> 0x20);
          if (dVar3 <= dVar4) {
            uVar5 = SUB84(dVar3,0);
            uVar6 = (int)((ulong)dVar3 >> 0x20);
          }
          pdVar2 = vec3::operator[]((vec3 *)(max.e + 2),local_ec);
          *pdVar2 = (double)(~-(ulong)NAN(dVar3) & CONCAT44(uVar6,uVar5) |
                            -(ulong)NAN(dVar3) & (ulong)dVar4);
          pdVar2 = vec3::operator[]((vec3 *)&j,local_ec);
          dVar3 = *pdVar2;
          pdVar2 = vec3::operator[]((vec3 *)local_e8,local_ec);
          dVar4 = *pdVar2;
          uVar5 = SUB84(dVar4,0);
          uVar6 = (int)((ulong)dVar4 >> 0x20);
          if (dVar4 <= dVar3) {
            uVar5 = SUB84(dVar3,0);
            uVar6 = (int)((ulong)dVar3 >> 0x20);
          }
          pdVar2 = vec3::operator[]((vec3 *)&j,local_ec);
          *pdVar2 = (double)(~-(ulong)NAN(dVar3) & CONCAT44(uVar6,uVar5) |
                            -(ulong)NAN(dVar3) & (ulong)dVar4);
        }
      }
    }
  }
  aabb::aabb(&local_120,(point3 *)(max.e + 2),(point3 *)&j);
  memcpy(&this->bbox,&local_120,0x30);
  return;
}

Assistant:

rotate_y(shared_ptr<hittable> object, double angle) : object(object) {
        auto radians = degrees_to_radians(angle);
        sin_theta = std::sin(radians);
        cos_theta = std::cos(radians);
        bbox = object->bounding_box();

        point3 min( infinity,  infinity,  infinity);
        point3 max(-infinity, -infinity, -infinity);

        for (int i = 0; i < 2; i++) {
            for (int j = 0; j < 2; j++) {
                for (int k = 0; k < 2; k++) {
                    auto x = i*bbox.x.max + (1-i)*bbox.x.min;
                    auto y = j*bbox.y.max + (1-j)*bbox.y.min;
                    auto z = k*bbox.z.max + (1-k)*bbox.z.min;

                    auto newx =  cos_theta*x + sin_theta*z;
                    auto newz = -sin_theta*x + cos_theta*z;

                    vec3 tester(newx, y, newz);

                    for (int c = 0; c < 3; c++) {
                        min[c] = std::fmin(min[c], tester[c]);
                        max[c] = std::fmax(max[c], tester[c]);
                    }
                }
            }
        }

        bbox = aabb(min, max);
    }